

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CollapseDatabaseArray(sqlite3 *db)

{
  undefined8 *puVar1;
  Db *pDVar2;
  Db *pDVar3;
  char *pcVar4;
  Btree *pBVar5;
  undefined8 uVar6;
  Schema *pSVar7;
  char *pcVar8;
  Btree *pBVar9;
  Schema *pSVar10;
  u8 uVar11;
  undefined6 uVar12;
  u8 uVar13;
  u8 uVar14;
  undefined6 uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  
  if (db->nDb < 3) {
    db->nDb = 2;
  }
  else {
    iVar17 = 2;
    lVar18 = 2;
    lVar19 = 0x40;
    do {
      pDVar2 = db->aDb;
      puVar1 = (undefined8 *)((long)&pDVar2->zDbSName + lVar19);
      if (*(long *)((long)&pDVar2->pBt + lVar19) == 0) {
        if ((void *)*puVar1 != (void *)0x0) {
          sqlite3DbFreeNN(db,(void *)*puVar1);
        }
        *puVar1 = 0;
      }
      else {
        lVar16 = (long)iVar17;
        if (lVar16 < lVar18) {
          pcVar4 = (char *)*puVar1;
          pBVar5 = (Btree *)puVar1[1];
          uVar6 = puVar1[2];
          pSVar7 = (Schema *)puVar1[3];
          pDVar3 = pDVar2 + lVar16;
          pDVar3->safety_level = (char)uVar6;
          pDVar3->bSyncSet = (char)((ulong)uVar6 >> 8);
          *(int6 *)&pDVar3->field_0x12 = (int6)((ulong)uVar6 >> 0x10);
          *(Schema **)(&pDVar3->safety_level + 8) = pSVar7;
          pDVar2[lVar16].zDbSName = pcVar4;
          pDVar2[lVar16].pBt = pBVar5;
        }
        iVar17 = iVar17 + 1;
      }
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x20;
    } while (lVar18 < db->nDb);
    db->nDb = iVar17;
    if (2 < iVar17) {
      return;
    }
  }
  pDVar3 = db->aDb;
  pDVar2 = db->aDbStatic;
  if (pDVar3 != pDVar2) {
    pcVar4 = pDVar3->zDbSName;
    pBVar5 = pDVar3->pBt;
    uVar13 = pDVar3->safety_level;
    uVar14 = pDVar3->bSyncSet;
    uVar15 = *(undefined6 *)&pDVar3->field_0x12;
    pSVar7 = pDVar3->pSchema;
    pcVar8 = pDVar3[1].zDbSName;
    pBVar9 = pDVar3[1].pBt;
    uVar11 = pDVar3[1].bSyncSet;
    uVar12 = *(undefined6 *)&pDVar3[1].field_0x12;
    pSVar10 = pDVar3[1].pSchema;
    db->aDbStatic[1].safety_level = pDVar3[1].safety_level;
    db->aDbStatic[1].bSyncSet = uVar11;
    *(undefined6 *)&db->aDbStatic[1].field_0x12 = uVar12;
    db->aDbStatic[1].pSchema = pSVar10;
    db->aDbStatic[1].zDbSName = pcVar8;
    db->aDbStatic[1].pBt = pBVar9;
    db->aDbStatic[0].safety_level = uVar13;
    db->aDbStatic[0].bSyncSet = uVar14;
    *(undefined6 *)&db->aDbStatic[0].field_0x12 = uVar15;
    db->aDbStatic[0].pSchema = pSVar7;
    pDVar2->zDbSName = pcVar4;
    db->aDbStatic[0].pBt = pBVar5;
    sqlite3DbFreeNN(db,pDVar3);
    db->aDb = pDVar2;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CollapseDatabaseArray(sqlite3 *db){
  int i, j;
  for(i=j=2; i<db->nDb; i++){
    struct Db *pDb = &db->aDb[i];
    if( pDb->pBt==0 ){
      sqlite3DbFree(db, pDb->zDbSName);
      pDb->zDbSName = 0;
      continue;
    }
    if( j<i ){
      db->aDb[j] = db->aDb[i];
    }
    j++;
  }
  db->nDb = j;
  if( db->nDb<=2 && db->aDb!=db->aDbStatic ){
    memcpy(db->aDbStatic, db->aDb, 2*sizeof(db->aDb[0]));
    sqlite3DbFree(db, db->aDb);
    db->aDb = db->aDbStatic;
  }
}